

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::cmFindCommon(cmFindCommon *this,cmExecutionStatus *status)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  cmValue l;
  string_view r;
  allocator<char> local_71 [33];
  string local_50;
  
  (this->UserGuessArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UserGuessArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UserHintsArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UserGuessArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UserHintsArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UserHintsArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CMakePathName)._M_dataplus._M_p = (pointer)&(this->CMakePathName).field_2;
  (this->CMakePathName)._M_string_length = 0;
  (this->CMakePathName).field_2._M_local_buf[0] = '\0';
  this->RegistryView = Target;
  (this->SearchPathSuffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SearchPathSuffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SearchPathSuffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PathGroupOrder).
  super__Vector_base<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PathGroupOrder).
  super__Vector_base<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PathGroupOrder).
  super__Vector_base<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Makefile = status->Makefile;
  this->Status = status;
  this->FindRootPathMode = RootPathModeBoth;
  this->NoDefaultPath = false;
  this->NoPackageRootPath = false;
  this->NoCMakePath = false;
  this->NoCMakeEnvironmentPath = false;
  this->NoCMakeEnvironmentPath = false;
  this->NoSystemEnvironmentPath = false;
  this->NoCMakeSystemPath = false;
  this->NoCMakeInstallPath = false;
  this->SearchFrameworkFirst = false;
  this->SearchFrameworkOnly = false;
  this->SearchFrameworkLast = false;
  this->SearchAppBundleFirst = false;
  this->SearchAppBundleOnly = false;
  this->SearchAppBundleLast = false;
  InitializeSearchPathGroups(this);
  this->DebugMode = false;
  PVar3 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0134,false);
  if (PVar3 != NEW) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"CMAKE_SIZEOF_VOID_P",local_71);
    l = cmMakefile::GetDefinition(this_00,&local_50);
    r._M_str = "8";
    r._M_len = 1;
    bVar2 = ::operator==(l,r);
    std::__cxx11::string::~string((string *)&local_50);
    this->RegistryView = bVar2 + Reg32;
  }
  return;
}

Assistant:

cmFindCommon::cmFindCommon(cmExecutionStatus& status)
  : Makefile(&status.GetMakefile())
  , Status(status)
{
  this->FindRootPathMode = RootPathModeBoth;
  this->NoDefaultPath = false;
  this->NoPackageRootPath = false;
  this->NoCMakePath = false;
  this->NoCMakeEnvironmentPath = false;
  this->NoSystemEnvironmentPath = false;
  this->NoCMakeSystemPath = false;
  this->NoCMakeInstallPath = false;

// OS X Bundle and Framework search policy.  The default is to
// search frameworks first on apple.
#if defined(__APPLE__)
  this->SearchFrameworkFirst = true;
  this->SearchAppBundleFirst = true;
#else
  this->SearchFrameworkFirst = false;
  this->SearchAppBundleFirst = false;
#endif
  this->SearchFrameworkOnly = false;
  this->SearchFrameworkLast = false;
  this->SearchAppBundleOnly = false;
  this->SearchAppBundleLast = false;

  this->InitializeSearchPathGroups();

  this->DebugMode = false;

  // Windows Registry views
  // When policy CMP0134 is not NEW, rely on previous behavior:
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0134) !=
      cmPolicies::NEW) {
    if (this->Makefile->GetDefinition("CMAKE_SIZEOF_VOID_P") == "8") {
      this->RegistryView = cmWindowsRegistry::View::Reg64;
    } else {
      this->RegistryView = cmWindowsRegistry::View::Reg32;
    }
  }
}